

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spread_volatile_semantics.cpp
# Opt level: O0

void __thiscall
spvtools::opt::SpreadVolatileSemantics::CollectTargetsForVolatileSemantics
          (SpreadVolatileSemantics *this,bool is_vk_memory_model_enabled)

{
  bool bVar1;
  ExecutionModel execution_model_00;
  uint32_t uVar2;
  Instruction *this_00;
  uint local_50;
  uint32_t var_id;
  uint32_t operand_index;
  ExecutionModel execution_model;
  Instruction *entry_point;
  iterator __end2;
  iterator __begin2;
  IteratorRange<spvtools::opt::InstructionList::iterator> *__range2;
  bool is_vk_memory_model_enabled_local;
  SpreadVolatileSemantics *this_local;
  
  Pass::get_module(&this->super_Pass);
  Module::entry_points((Module *)&__begin2);
  IteratorRange<spvtools::opt::InstructionList::iterator>::begin
            ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&__end2);
  IteratorRange<spvtools::opt::InstructionList::iterator>::end
            ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&entry_point);
  while (bVar1 = utils::operator!=(&__end2.super_iterator,
                                   (iterator_template<spvtools::opt::Instruction> *)&entry_point),
        bVar1) {
    this_00 = utils::IntrusiveList<spvtools::opt::Instruction>::
              iterator_template<spvtools::opt::Instruction>::operator*(&__end2.super_iterator);
    execution_model_00 = opt::Instruction::GetSingleWordInOperand(this_00,0);
    for (local_50 = 3; uVar2 = opt::Instruction::NumInOperands(this_00), local_50 < uVar2;
        local_50 = local_50 + 1) {
      uVar2 = opt::Instruction::GetSingleWordInOperand(this_00,local_50);
      bVar1 = IsTargetForVolatileSemantics(this,uVar2,execution_model_00);
      if ((bVar1) &&
         ((is_vk_memory_model_enabled ||
          (bVar1 = IsTargetUsedByNonVolatileLoadInEntryPoint(this,uVar2,this_00), bVar1)))) {
        MarkVolatileSemanticsForVariable(this,uVar2,this_00);
      }
    }
    InstructionList::iterator::operator++(&__end2);
  }
  return;
}

Assistant:

void SpreadVolatileSemantics::CollectTargetsForVolatileSemantics(
    const bool is_vk_memory_model_enabled) {
  for (Instruction& entry_point : get_module()->entry_points()) {
    spv::ExecutionModel execution_model =
        static_cast<spv::ExecutionModel>(entry_point.GetSingleWordInOperand(0));
    for (uint32_t operand_index = kOpEntryPointInOperandInterface;
         operand_index < entry_point.NumInOperands(); ++operand_index) {
      uint32_t var_id = entry_point.GetSingleWordInOperand(operand_index);
      if (!IsTargetForVolatileSemantics(var_id, execution_model)) {
        continue;
      }
      if (is_vk_memory_model_enabled ||
          IsTargetUsedByNonVolatileLoadInEntryPoint(var_id, &entry_point)) {
        MarkVolatileSemanticsForVariable(var_id, &entry_point);
      }
    }
  }
}